

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

void __thiscall
soul::HEARTGenerator::initialiseArrayOrStructElements
          (HEARTGenerator *this,Expression *target,
          ArrayView<soul::pool_ref<soul::AST::Expression>_> list,Context *errorLocation)

{
  char cVar1;
  Expression *e;
  Member *pMVar2;
  long lVar3;
  pool_ref<soul::AST::Expression> *ppVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Structure *pSVar7;
  ArrayElement *dest;
  undefined4 extraout_var_02;
  Expression *source;
  size_t numberAvailable;
  ulong uVar8;
  long lVar9;
  pool_ptr<soul::AST::Constant> constElement;
  ulong local_78;
  CodeLocation *local_70;
  pool_ref<soul::AST::Expression> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  BlockBuilder *local_40;
  ulong local_38;
  Type *type;
  
  local_68 = list.s;
  iVar6 = (*(target->super_Object)._vptr_Object[2])(target);
  ppVar4 = local_68;
  type = (Type *)CONCAT44(extraout_var,iVar6);
  if (((type->category & ~wrap) != vector) && (type->category != array || type->boundingSize == 0))
  {
    throwInternalCompilerError
              ("targetType.isFixedSizeAggregate()","initialiseArrayOrStructElements",0x3f9);
  }
  numberAvailable = (long)list.e - (long)local_68 >> 3;
  SanityCheckPass::throwErrorIfWrongNumberOfElements(errorLocation,type,numberAvailable);
  iVar6 = (*(target->super_Object)._vptr_Object[2])(target);
  cVar1 = *(char *)CONCAT44(extraout_var_00,iVar6);
  local_40 = &(this->builder).super_BlockBuilder;
  BlockBuilder::addZeroAssignment(local_40,target);
  if (list.e != ppVar4) {
    local_70 = &(target->super_Object).location;
    local_38 = numberAvailable + (numberAvailable == 0);
    lVar9 = 0x20;
    uVar8 = 0;
    do {
      e = local_68[uVar8].object;
      (*(e->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_78,e);
      if (local_78 == 0) {
LAB_0023bf4e:
        if (cVar1 == '\x06') {
          iVar6 = (*(target->super_Object)._vptr_Object[2])(target);
          pSVar7 = Type::getStructRef((Type *)CONCAT44(extraout_var_01,iVar6));
          if ((pSVar7->members).numActive <= uVar8) {
            throwInternalCompilerError("index < numActive","operator[]",0x9f);
          }
          pMVar2 = (pSVar7->members).items;
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          lVar3 = *(long *)((long)pMVar2 + lVar9 + -8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,lVar3,*(long *)(&(pMVar2->type).category + lVar9) + lVar3);
          dest = (ArrayElement *)
                 PoolAllocator::
                 allocate<soul::heart::StructElement,soul::CodeLocation&,soul::heart::Expression&,std::__cxx11::string>
                           (&((this->builder).super_BlockBuilder.module)->allocator->pool,local_70,
                            target,&local_60);
        }
        else {
          local_78 = uVar8;
          dest = PoolAllocator::
                 allocate<soul::heart::ArrayElement,soul::CodeLocation&,soul::heart::Expression&,unsigned_long&>
                           (&((this->builder).super_BlockBuilder.module)->allocator->pool,local_70,
                            target,&local_78);
        }
        iVar6 = (*(dest->super_Expression).super_Object._vptr_Object[2])(dest);
        source = evaluateAsExpression(this,e,(Type *)CONCAT44(extraout_var_02,iVar6));
        BlockBuilder::addAssignment(local_40,&dest->super_Expression,source);
        if ((cVar1 == '\x06') &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2)) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar5 = soul::Value::isZero((Value *)(local_78 + 0x30));
        if (!bVar5) goto LAB_0023bf4e;
      }
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x40;
    } while (local_38 != uVar8);
  }
  return;
}

Assistant:

void initialiseArrayOrStructElements (heart::Expression& target, ArrayView<pool_ref<AST::Expression>> list,
                                          const AST::Context& errorLocation)
    {
        const auto& targetType = target.getType();
        SOUL_ASSERT (targetType.isFixedSizeAggregate());
        SanityCheckPass::throwErrorIfWrongNumberOfElements (errorLocation, targetType, list.size());
        bool isStruct = target.getType().isStruct();

        builder.addZeroAssignment (target);

        for (size_t i = 0; i < list.size(); ++i)
        {
            auto& sourceValue = list[i].get();

            if (auto constElement = sourceValue.getAsConstant())
                if (constElement->value.isZero()) // no need to assign to elements which are zero
                    continue;

            createAssignment (isStruct ? (heart::Expression&) builder.createStructElement (target, target.getType().getStructRef().getMemberName (i))
                                       : (heart::Expression&) builder.createFixedArrayElement (target, i),
                              sourceValue);
        }
    }